

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

logic_t __thiscall slang::SVInt::reductionOr(SVInt *this)

{
  bool bVar1;
  uint uVar2;
  uint64_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar1 = (this->super_SVIntStorage).unknownFlag;
  uVar2 = (this->super_SVIntStorage).bitWidth;
  if (bVar1 != true) {
    if (uVar2 < 0x41) {
      return (logic_t)((this->super_SVIntStorage).field_0.val != 0);
    }
    if (0x3f < uVar2 + 0x3f) {
      uVar4 = 0;
      do {
        if ((this->super_SVIntStorage).field_0.pVal[uVar4] != 0) {
          return (logic_t)'\x01';
        }
        uVar4 = uVar4 + 1;
      } while ((uVar2 + 0x3f >> 6) << (bVar1 & 0x1fU) != uVar4);
    }
    return (logic_t)'\0';
  }
  if (0x3f < uVar2 + 0x3f) {
    uVar4 = (ulong)(uVar2 + 0x3f >> 6);
    puVar3 = (this->super_SVIntStorage).field_0.pVal;
    uVar5 = 0;
    do {
      if ((puVar3[uVar5] & ~puVar3[uVar4 + uVar5]) != 0) {
        return (logic_t)'\x01';
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return (logic_t)0x80;
}

Assistant:

logic_t SVInt::reductionOr() const {
    if (unknownFlag) {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words; i++) {
            if (pVal[i] & ~pVal[i + words])
                return logic_t(true);
        }
        return logic_t::x;
    }

    if (isSingleWord())
        return logic_t(val != 0);
    else {
        for (uint32_t i = 0; i < getNumWords(); i++) {
            if (pVal[i] != 0)
                return logic_t(true);
        }
    }
    return logic_t(false);
}